

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttcmap.c
# Opt level: O1

FT_UInt32 tt_cmap2_char_next(TT_CMap cmap,FT_UInt32 *pcharcode)

{
  FT_Byte *table;
  FT_UInt32 FVar1;
  byte bVar2;
  ushort *puVar3;
  ushort uVar4;
  ushort uVar5;
  ushort uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  ushort *puVar10;
  FT_UInt32 FVar11;
  uint uVar12;
  FT_UInt32 char_code;
  bool bVar13;
  FT_UInt32 local_3c;
  
  char_code = *pcharcode + 1;
  local_3c = 0;
  FVar11 = 0;
  if (char_code < 0x10000) {
    table = cmap->data;
    FVar11 = 0;
    local_3c = 0;
    do {
      puVar3 = (ushort *)tt_cmap2_get_subheader(table,char_code);
      if (puVar3 != (ushort *)0x0) {
        uVar4 = *puVar3 << 8 | *puVar3 >> 8;
        uVar5 = puVar3[1] << 8 | puVar3[1] >> 8;
        uVar12 = char_code & 0xff;
        if ((char_code < 0x100) && ((uint)uVar5 + (uint)uVar4 <= uVar12)) {
          bVar2 = 2;
          char_code = 0x100;
        }
        else {
          uVar6 = puVar3[3] << 8 | puVar3[3] >> 8;
          if (uVar6 == 0) {
            bVar2 = char_code == 0x100 ^ 5;
          }
          else {
            uVar8 = (uint)uVar4;
            uVar7 = uVar12 - uVar8;
            uVar9 = (uint)uVar4;
            if (uVar12 >= uVar8 && uVar7 != 0) {
              uVar9 = uVar12;
            }
            if (uVar12 < uVar8) {
              uVar7 = 0;
            }
            char_code = (char_code & 0xff00) + uVar9;
            if (uVar7 < uVar5) {
              puVar10 = (ushort *)((long)puVar3 + (ulong)((uint)uVar6 + uVar7 * 2) + 6);
              do {
                uVar4 = *puVar10 << 8 | *puVar10 >> 8;
                FVar1 = FVar11;
                if (uVar4 != 0) {
                  FVar11 = (uint)uVar4 + (uint)(ushort)(puVar3[2] << 8 | puVar3[2] >> 8) & 0xffff;
                  FVar1 = 0;
                  if (FVar11 != 0) {
                    bVar2 = 4;
                    local_3c = char_code;
                    goto LAB_00244ac3;
                  }
                }
                FVar11 = FVar1;
                uVar7 = uVar7 + 1;
                char_code = char_code + 1;
                puVar10 = puVar10 + 1;
              } while (uVar7 < uVar5);
            }
            char_code = (char_code - 1) + (uint)(uVar5 == 0);
            bVar2 = 0;
          }
        }
LAB_00244ac3:
        switch(bVar2) {
        case 0:
        case 5:
          break;
        default:
          return FVar11;
        case 2:
          goto switchD_00244ad1_caseD_2;
        case 4:
          goto switchD_00244ad1_caseD_4;
        }
      }
      uVar12 = char_code + 1;
      bVar13 = char_code < 0x100;
      char_code = (char_code & 0xffffff00) + 0x100;
      if (bVar13) {
        char_code = uVar12;
      }
switchD_00244ad1_caseD_2:
    } while (char_code < 0x10000);
  }
switchD_00244ad1_caseD_4:
  *pcharcode = local_3c;
  return FVar11;
}

Assistant:

FT_CALLBACK_DEF( FT_UInt32 )
  tt_cmap2_char_next( TT_CMap     cmap,
                      FT_UInt32  *pcharcode )
  {
    FT_Byte*   table    = cmap->data;
    FT_UInt    gindex   = 0;
    FT_UInt32  result   = 0;
    FT_UInt32  charcode = *pcharcode + 1;
    FT_Byte*   subheader;


    while ( charcode < 0x10000UL )
    {
      subheader = tt_cmap2_get_subheader( table, charcode );
      if ( subheader )
      {
        FT_Byte*  p       = subheader;
        FT_UInt   start   = TT_NEXT_USHORT( p );
        FT_UInt   count   = TT_NEXT_USHORT( p );
        FT_Int    delta   = TT_NEXT_SHORT ( p );
        FT_UInt   offset  = TT_PEEK_USHORT( p );
        FT_UInt   char_lo = (FT_UInt)( charcode & 0xFF );
        FT_UInt   pos, idx;


        if ( char_lo >= start + count && charcode <= 0xFF )
        {
          /* this happens only for a malformed cmap */
          charcode = 0x100;
          continue;
        }

        if ( offset == 0 )
        {
          if ( charcode == 0x100 )
            goto Exit; /* this happens only for a malformed cmap */
          goto Next_SubHeader;
        }

        if ( char_lo < start )
        {
          char_lo = start;
          pos     = 0;
        }
        else
          pos = (FT_UInt)( char_lo - start );

        p       += offset + pos * 2;
        charcode = FT_PAD_FLOOR( charcode, 256 ) + char_lo;

        for ( ; pos < count; pos++, charcode++ )
        {
          idx = TT_NEXT_USHORT( p );

          if ( idx != 0 )
          {
            gindex = (FT_UInt)( (FT_Int)idx + delta ) & 0xFFFFU;
            if ( gindex != 0 )
            {
              result = charcode;
              goto Exit;
            }
          }
        }

        /* if unsuccessful, avoid `charcode' leaving */
        /* the current 256-character block           */
        if ( count )
          charcode--;
      }

      /* If `charcode' is <= 0xFF, retry with `charcode + 1'.      */
      /* Otherwise jump to the next 256-character block and retry. */
    Next_SubHeader:
      if ( charcode <= 0xFF )
        charcode++;
      else
        charcode = FT_PAD_FLOOR( charcode, 0x100 ) + 0x100;
    }

  Exit:
    *pcharcode = result;

    return gindex;
  }